

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O3

Value __thiscall jbcoin::STLedgerEntry::getJson(STLedgerEntry *this,int options)

{
  ValueHolder VVar1;
  ValueHolder *pVVar2;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  Value VVar4;
  ValueHolder local_40;
  ushort local_38;
  string local_30;
  undefined4 extraout_var;
  
  STObject::getJson(&this->super_STObject,options);
  strHex<unsigned_char_const*>
            (&local_30,(jbcoin *)(CONCAT44(in_register_00000034,options) + 0x30),&DAT_00000020,
             in_ECX);
  local_38 = 0x104;
  Json::valueAllocator();
  VVar1._0_4_ = (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                          (Json::valueAllocator::valueAllocator,local_30._M_dataplus._M_p,
                           (ulong)(uint)local_30._M_string_length);
  VVar1._4_4_ = extraout_var;
  local_40 = VVar1;
  pVVar2 = &Json::Value::resolveReference((Value *)this,"index",true)->value_;
  local_40 = *pVVar2;
  *pVVar2 = VVar1;
  local_38 = *(ushort *)(pVVar2 + 1);
  *(ushort *)(pVVar2 + 1) = local_38 & 0xfe00 | 0x104;
  local_38 = local_38 & 0x1ff;
  Json::Value::~Value((Value *)&local_40);
  uVar3 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    uVar3 = extraout_RDX_00;
  }
  VVar4._8_8_ = uVar3;
  VVar4.value_.map_ = (ObjectValues *)this;
  return VVar4;
}

Assistant:

Json::Value STLedgerEntry::getJson (int options) const
{
    Json::Value ret (STObject::getJson (options));

    ret[jss::index] = to_string (key_);

    return ret;
}